

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O3

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1,_2,_0,_1>
     ::run(Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *lhs,
          Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false> *rhs)

{
  ulong uVar1;
  float *_lhs;
  long size;
  long lhsStride;
  float *rhs_00;
  undefined8 *puVar2;
  float *pfVar3;
  float *__ptr;
  float afStack_28 [2];
  
  pfVar3 = afStack_28;
  uVar1 = (rhs->super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows
          .m_value;
  if (uVar1 >> 0x3e == 0) {
    rhs_00 = (rhs->
             super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
             m_data;
    if (rhs_00 == (float *)0x0) {
      if (uVar1 < 0x8001) {
        rhs_00 = (float *)((long)afStack_28 - (uVar1 * 4 + 0x1e & 0xfffffffffffffff0));
        pfVar3 = rhs_00;
        __ptr = rhs_00;
      }
      else {
        rhs_00 = (float *)malloc(uVar1 * 4);
        if (((ulong)rhs_00 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        __ptr = rhs_00;
        if (rhs_00 == (float *)0x0) goto LAB_00175640;
      }
    }
    else {
      pfVar3 = afStack_28;
      __ptr = (float *)0x0;
    }
    _lhs = (lhs->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
           .m_data;
    size = (lhs->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
           .m_cols.m_value;
    lhsStride = (((lhs->
                  super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage
                .m_rows;
    pfVar3[-2] = 2.143118e-39;
    pfVar3[-1] = 0.0;
    triangular_solve_vector<float,_float,_long,_1,_2,_false,_0>::run(size,_lhs,lhsStride,rhs_00);
    if (0x8000 < uVar1) {
      pfVar3[-2] = 2.143142e-39;
      pfVar3[-1] = 0.0;
      free(__ptr);
    }
    return;
  }
LAB_00175640:
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = boost::program_options::detail::cmdline::cmdline;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static EIGEN_DEVICE_FUNC void run(const Lhs& lhs, Rhs& rhs)
  {
    ActualLhsType actualLhs = LhsProductTraits::extract(lhs);

    // FIXME find a way to allow an inner stride if packet_traits<Scalar>::size==1

    bool useRhsDirectly = Rhs::InnerStrideAtCompileTime==1 || rhs.innerStride()==1;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhs,rhs.size(),
                                                  (useRhsDirectly ? rhs.data() : 0));

    if(!useRhsDirectly)
      MappedRhs(actualRhs,rhs.size()) = rhs;

    triangular_solve_vector<LhsScalar, RhsScalar, Index, Side, Mode, LhsProductTraits::NeedToConjugate,
                            (int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor>
      ::run(actualLhs.cols(), actualLhs.data(), actualLhs.outerStride(), actualRhs);

    if(!useRhsDirectly)
      rhs = MappedRhs(actualRhs, rhs.size());
  }